

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

KeyNode * __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertOrReplaceNode(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,KeyNode *node)

{
  ViewType VVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  NodeBase *node_00;
  NodeAndBucket NVar4;
  map_index_t local_44;
  map_index_t b;
  NodeAndBucket p;
  KeyNode *to_erase;
  KeyNode *node_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  p.bucket = 0;
  p._12_4_ = 0;
  pbVar3 = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::key(node);
  VVar1 = (ViewType)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar3);
  NVar4 = FindHelper(this,VVar1,(TreeIterator *)0x0);
  node_00 = NVar4.node;
  local_44 = NVar4.bucket;
  if (node_00 == (NodeBase *)0x0) {
    bVar2 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar2) {
      pbVar3 = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::key(node);
      VVar1 = (ViewType)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar3);
      local_44 = BucketNumber(this,VVar1);
    }
  }
  else {
    erase_no_destroy(this,local_44,(KeyNode *)node_00);
    p._8_8_ = node_00;
  }
  InsertUnique(this,local_44,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return (KeyNode *)p._8_8_;
}

Assistant:

KeyNode* InsertOrReplaceNode(KeyNode* node) {
    KeyNode* to_erase = nullptr;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (p.node != nullptr) {
      erase_no_destroy(p.bucket, static_cast<KeyNode*>(p.node));
      to_erase = static_cast<KeyNode*>(p.node);
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return to_erase;
  }